

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReach.c
# Opt level: O0

DdNode * Abc_NtkInitStateVarMap(DdManager *dd,Abc_Ntk_t *pNtk,int fVerbose)

{
  DdNode **ppDVar1;
  int iVar2;
  DdNode **x;
  DdNode **y;
  Abc_Obj_t *pObj;
  DdNode *pDVar3;
  int local_54;
  int i;
  Abc_Obj_t *pLatch;
  DdNode *bVar;
  DdNode *bProd;
  DdNode *bTemp;
  DdNode **pbVarsY;
  DdNode **pbVarsX;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  DdManager *dd_local;
  
  x = (DdNode **)malloc((long)dd->size << 3);
  y = (DdNode **)malloc((long)dd->size << 3);
  bVar = dd->one;
  Cudd_Ref(bVar);
  for (local_54 = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_54 < iVar2; local_54 = local_54 + 1) {
    pObj = Abc_NtkBox(pNtk,local_54);
    iVar2 = Abc_ObjIsLatch(pObj);
    if (iVar2 != 0) {
      ppDVar1 = dd->vars;
      iVar2 = Abc_NtkPiNum(pNtk);
      x[local_54] = ppDVar1[iVar2 + local_54];
      ppDVar1 = dd->vars;
      iVar2 = Abc_NtkCiNum(pNtk);
      y[local_54] = ppDVar1[iVar2 + local_54];
      pDVar3 = x[local_54];
      iVar2 = Abc_LatchIsInit1(pObj);
      pDVar3 = Cudd_bddAnd(dd,bVar,(DdNode *)
                                   ((ulong)pDVar3 ^ (long)(int)(uint)((iVar2 != 0 ^ 0xffU) & 1)));
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDeref(dd,bVar);
      bVar = pDVar3;
    }
  }
  iVar2 = Abc_NtkLatchNum(pNtk);
  Cudd_SetVarMap(dd,x,y,iVar2);
  if (x != (DdNode **)0x0) {
    free(x);
  }
  if (y != (DdNode **)0x0) {
    free(y);
  }
  Cudd_Deref(bVar);
  return bVar;
}

Assistant:

DdNode * Abc_NtkInitStateVarMap( DdManager * dd, Abc_Ntk_t * pNtk, int fVerbose )
{
    DdNode ** pbVarsX, ** pbVarsY;
    DdNode * bTemp, * bProd, * bVar;
    Abc_Obj_t * pLatch;
    int i;

    // set the variable mapping for Cudd_bddVarMap()
    pbVarsX = ABC_ALLOC( DdNode *, dd->size );
    pbVarsY = ABC_ALLOC( DdNode *, dd->size );
    bProd = b1;         Cudd_Ref( bProd );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        pbVarsX[i] = dd->vars[ Abc_NtkPiNum(pNtk) + i ];
        pbVarsY[i] = dd->vars[ Abc_NtkCiNum(pNtk) + i ];
        // get the initial value of the latch
        bVar  = Cudd_NotCond( pbVarsX[i], !Abc_LatchIsInit1(pLatch) );
        bProd = Cudd_bddAnd( dd, bTemp = bProd, bVar );      Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bTemp ); 
    }
    Cudd_SetVarMap( dd, pbVarsX, pbVarsY, Abc_NtkLatchNum(pNtk) );
    ABC_FREE( pbVarsX );
    ABC_FREE( pbVarsY );

    Cudd_Deref( bProd );
    return bProd;
}